

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void identPut(char *z,int *pIdx,char *zSignedIdent)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar4 = *pIdx;
  lVar6 = (long)iVar4;
  lVar5 = 0;
  while ((uVar3 = (ulong)(byte)zSignedIdent[lVar5], uVar3 != 0 &&
         ((uVar3 == 0x5f || ((""[uVar3] & 6) != 0))))) {
    lVar5 = lVar5 + 1;
  }
  if ((ulong)(byte)*zSignedIdent - 0x3a < 0xfffffffffffffff6) {
    iVar2 = sqlite3KeywordCode((uchar *)zSignedIdent,(int)lVar5);
    if (((uVar3 == 0) && (lVar5 != 0)) && (iVar2 == 0x3b)) {
      bVar1 = false;
      goto LAB_001685db;
    }
  }
  iVar4 = iVar4 + 1;
  z[lVar6] = '\"';
  bVar1 = true;
LAB_001685db:
  while( true ) {
    lVar5 = (long)iVar4;
    if (*zSignedIdent == '\0') break;
    z[lVar5] = *zSignedIdent;
    uVar3 = lVar5 + 1;
    if (*zSignedIdent == '\"') {
      z[uVar3] = '\"';
      uVar3 = (ulong)(iVar4 + 2);
    }
    zSignedIdent = zSignedIdent + 1;
    iVar4 = (int)uVar3;
  }
  if (bVar1) {
    iVar4 = iVar4 + 1;
    z[lVar5] = '\"';
  }
  z[iVar4] = '\0';
  *pIdx = iVar4;
  return;
}

Assistant:

static void identPut(char *z, int *pIdx, char *zSignedIdent){
  unsigned char *zIdent = (unsigned char*)zSignedIdent;
  int i, j, needQuote;
  i = *pIdx;

  for(j=0; zIdent[j]; j++){
    if( !sqlite3Isalnum(zIdent[j]) && zIdent[j]!='_' ) break;
  }
  needQuote = sqlite3Isdigit(zIdent[0])
            || sqlite3KeywordCode(zIdent, j)!=TK_ID
            || zIdent[j]!=0
            || j==0;

  if( needQuote ) z[i++] = '"';
  for(j=0; zIdent[j]; j++){
    z[i++] = zIdent[j];
    if( zIdent[j]=='"' ) z[i++] = '"';
  }
  if( needQuote ) z[i++] = '"';
  z[i] = 0;
  *pIdx = i;
}